

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall MarrayTest::resizeTest<(andres::CoordinateOrder)1>(MarrayTest *this)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_04;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_05;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_06;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_07;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_08;
  size_t sVar1;
  reference piVar2;
  int i;
  int iVar3;
  uint uVar4;
  int iVar5;
  int x;
  ulong uVar6;
  int z;
  int z_2;
  bool bVar7;
  allocator_type aVar8;
  CoordinateOrder local_bc;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape0;
  Marray<int,_std::allocator<unsigned_long>_> m;
  allocator_type local_39;
  MarrayTest *local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,(CoordinateOrder *)&shape0,
             (allocator_type *)&local_bc);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0xc;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xc;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&shape0);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  bVar7 = false;
  if ((sVar1 == 0xc) &&
     (bVar7 = false, m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 0xc
     )) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    bVar7 = sVar1 == 1;
  }
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = bVar7;
  test((bool *)&shape0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&m);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape0,0,(allocator_type *)&m)
  ;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  local_bc = LastMajorOrder;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&local_bc,&local_39);
  begin._M_current._4_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin._M_current._0_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_bc = LastMajorOrder;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_bc);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,(CoordinateOrder *)&shape0,
             (allocator_type *)&local_bc);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&shape0);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  bVar7 = false;
  if ((sVar1 == 1) &&
     (bVar7 = false, m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 1))
  {
    piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
    bVar7 = *piVar2 == this->scalar_;
  }
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = bVar7;
  test((bool *)&shape0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&m,(int *)&shape0,&andres::defaultOrder,(allocator_type *)&local_bc);
  local_bc = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_bc);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  aVar8 = (allocator_type)0x0;
  if ((sVar1 == 0x18) &&
     (aVar8 = (allocator_type)0x0,
     m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 0x18)) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    aVar8 = (allocator_type)(sVar1 == 1);
  }
  local_bc._0_1_ = aVar8;
  test((bool *)&local_bc);
  piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
  local_bc = CONCAT31(local_bc._1_3_,*piVar2 == 1);
  test((bool *)&local_bc);
  for (iVar3 = 1; iVar3 != 0x18; iVar3 = iVar3 + 1) {
    piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,iVar3);
    local_bc = CONCAT31(local_bc._1_3_,*piVar2 == 3);
    test((bool *)&local_bc);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0xc;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,(CoordinateOrder *)&shape0,
             (allocator_type *)&local_bc);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&shape0);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  bVar7 = false;
  if ((sVar1 == 0x18) &&
     (bVar7 = false,
     m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 0x18)) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    bVar7 = sVar1 == 1;
  }
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = bVar7;
  test((bool *)&shape0);
  for (uVar4 = 0; uVar4 != 0x18; uVar4 = uVar4 + 1) {
    if (uVar4 < 0xc) {
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&m,uVar4);
      shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = *piVar2 == this->scalar_;
      test((bool *)&shape0);
    }
    else {
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&m,uVar4);
      shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = *piVar2 == 3;
      test((bool *)&shape0);
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&m,(int *)&shape0,&andres::defaultOrder,(allocator_type *)&shape);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape,3,(allocator_type *)&local_bc);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 5;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 5;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  local_bc = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_bc);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  if (sVar1 == 5) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,1);
    if (sVar1 != 5) goto LAB_00195c79;
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,2);
    bVar7 = false;
    if ((sVar1 == 2) &&
       (m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 0x32)) {
      sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                        (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
      bVar7 = sVar1 == 3;
    }
  }
  else {
LAB_00195c79:
    bVar7 = false;
  }
  local_bc = CONCAT31(local_bc._1_3_,bVar7);
  test((bool *)&local_bc);
  for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
    for (iVar5 = 0; iVar5 != 5; iVar5 = iVar5 + 1) {
      for (sVar1 = 0; sVar1 != 5; sVar1 = sVar1 + 1) {
        if ((iVar3 == 0 && (int)sVar1 == 0) && iVar5 == 0) {
          piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)&m,0,0,0);
          local_bc = CONCAT31(local_bc._1_3_,*piVar2 == 1);
          test((bool *)&local_bc);
        }
        else {
          piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar1,iVar5,iVar3)
          ;
          local_bc = CONCAT31(local_bc._1_3_,*piVar2 == 3);
          test((bool *)&local_bc);
        }
      }
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0xc;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,(CoordinateOrder *)&shape0,
             (allocator_type *)&local_bc);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape0,3,(allocator_type *)&local_bc);
  begin_00._M_current._4_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_00._M_current._0_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_00._M_current = 5;
  begin_00._M_current[1] = 5;
  begin_00._M_current[2] = 2;
  local_bc = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_bc);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  if (sVar1 == 5) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,1);
    if (sVar1 != 5) goto LAB_00195def;
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,2);
    bVar7 = false;
    if ((sVar1 == 2) &&
       (m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 0x32)) {
      sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                        (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
      bVar7 = sVar1 == 3;
    }
  }
  else {
LAB_00195def:
    bVar7 = false;
  }
  local_bc = CONCAT31(local_bc._1_3_,bVar7);
  test((bool *)&local_bc);
  local_38 = this;
  for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
    for (iVar5 = 0; iVar5 != 5; iVar5 = iVar5 + 1) {
      for (sVar1 = 0; sVar1 != 5; sVar1 = sVar1 + 1) {
        if (iVar5 == 0 && iVar3 == 0) {
          piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar1,0,0);
          local_bc = CONCAT31(local_bc._1_3_,*piVar2 == local_38->scalar_);
          test((bool *)&local_bc);
        }
        else {
          piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar1,iVar5,iVar3)
          ;
          local_bc = CONCAT31(local_bc._1_3_,*piVar2 == 3);
          test((bool *)&local_bc);
        }
      }
      this = local_38;
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,(CoordinateOrder *)&shape0,
             (allocator_type *)&local_bc);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 6;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&shape0);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  if (sVar1 == 3) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,1);
    bVar7 = false;
    if ((sVar1 == 2) &&
       (bVar7 = false, m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 6
       )) {
      sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                        (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
      bVar7 = sVar1 == 2;
    }
  }
  else {
    bVar7 = false;
  }
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = bVar7;
  test((bool *)&shape0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,(CoordinateOrder *)&shape0,
             (allocator_type *)&local_bc);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&shape0);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  if (sVar1 == 6) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,1);
    bVar7 = false;
    if ((sVar1 == 4) &&
       (bVar7 = false,
       m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 0x18)) {
      sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                        (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
      bVar7 = sVar1 == 2;
    }
  }
  else {
    bVar7 = false;
  }
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = bVar7;
  test((bool *)&shape0);
  for (uVar4 = 0; uVar4 != 4; uVar4 = uVar4 + 1) {
    for (uVar6 = 0; uVar6 != 6; uVar6 = uVar6 + 1) {
      if (uVar6 < 3 && uVar4 < 2) {
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&m,uVar6,uVar4);
        shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = *piVar2 == this->scalar_;
        test((bool *)&shape0);
      }
      else {
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&m,uVar6,uVar4);
        shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = *piVar2 == 3;
        test((bool *)&shape0);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,(CoordinateOrder *)&shape0,
             (allocator_type *)&local_bc);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape0,0,(allocator_type *)&local_bc);
  begin_01._M_current._4_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_01._M_current._0_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_bc = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_01,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_bc);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,(CoordinateOrder *)&shape0,
             (allocator_type *)&local_bc);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape0,1,(allocator_type *)&local_bc);
  begin_02._M_current._4_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_02._M_current._0_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_02._M_current = 0xc;
  local_bc = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_02,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_bc);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  local_bc = CONCAT31(local_bc._1_3_,
                      m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
                      0xc && sVar1 == 0xc);
  test((bool *)&local_bc);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,(CoordinateOrder *)&shape0,
             (allocator_type *)&local_bc);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape0,1,(allocator_type *)&local_bc);
  begin_03._M_current._4_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_03._M_current._0_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_03._M_current = 0xc;
  local_bc = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_03,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_bc);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  bVar7 = false;
  if ((sVar1 == 0xc) &&
     (bVar7 = false, m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 0xc
     )) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    bVar7 = sVar1 == 1;
  }
  local_bc = CONCAT31(local_bc._1_3_,bVar7);
  test((bool *)&local_bc);
  for (iVar3 = 0; iVar3 != 6; iVar3 = iVar3 + 1) {
    piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,iVar3);
    local_bc = CONCAT31(local_bc._1_3_,*piVar2 == this->scalar_);
    test((bool *)&local_bc);
  }
  for (iVar3 = 6; iVar3 != 0xc; iVar3 = iVar3 + 1) {
    piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,iVar3);
    local_bc = CONCAT31(local_bc._1_3_,*piVar2 == 3);
    test((bool *)&local_bc);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,(CoordinateOrder *)&shape0,
             (allocator_type *)&local_bc);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape0,3,(allocator_type *)&local_bc);
  begin_04._M_current._4_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_04._M_current._0_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_04._M_current = 5;
  begin_04._M_current[1] = 5;
  begin_04._M_current[2] = 2;
  local_bc = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_04,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_bc);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  if (sVar1 == 5) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,1);
    if (sVar1 != 5) goto LAB_00196454;
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,2);
    bVar7 = false;
    if ((sVar1 == 2) &&
       (m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 0x32)) {
      sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                        (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
      bVar7 = sVar1 == 3;
    }
  }
  else {
LAB_00196454:
    bVar7 = false;
  }
  local_bc = CONCAT31(local_bc._1_3_,bVar7);
  test((bool *)&local_bc);
  for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
    for (uVar4 = 0; uVar4 != 5; uVar4 = uVar4 + 1) {
      for (uVar6 = 0; uVar6 != 5; uVar6 = uVar6 + 1) {
        if (uVar6 < 3 && (uVar4 < 2 && iVar3 == 0)) {
          piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)&m,uVar6,uVar4,0);
          local_bc = CONCAT31(local_bc._1_3_,*piVar2 == local_38->scalar_);
          test((bool *)&local_bc);
        }
        else {
          piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)&m,uVar6,uVar4,iVar3)
          ;
          local_bc = CONCAT31(local_bc._1_3_,*piVar2 == 3);
          test((bool *)&local_bc);
        }
      }
      this = local_38;
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,(CoordinateOrder *)&shape0,
             (allocator_type *)&local_bc);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 8;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&shape0);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  if (sVar1 == 2) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,1);
    if (sVar1 != 2) goto LAB_00196600;
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,2);
    bVar7 = false;
    if ((sVar1 == 2) &&
       (bVar7 = false, m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 8
       )) {
      sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                        (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
      bVar7 = sVar1 == 3;
    }
  }
  else {
LAB_00196600:
    bVar7 = false;
  }
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = bVar7;
  test((bool *)&shape0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,(CoordinateOrder *)&shape0,
             (allocator_type *)&local_bc);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 5;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 5;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&shape0);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  if (sVar1 == 5) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,1);
    if (sVar1 == 5) {
      sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,2);
      bVar7 = false;
      if ((sVar1 == 2) &&
         (bVar7 = false,
         m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 0x32)) {
        sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                          (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
        bVar7 = sVar1 == 3;
      }
      goto LAB_001966fb;
    }
  }
  bVar7 = false;
LAB_001966fb:
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = bVar7;
  test((bool *)&shape0);
  for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
    for (iVar5 = 0; iVar5 != 5; iVar5 = iVar5 + 1) {
      for (uVar6 = 0; uVar6 != 5; uVar6 = uVar6 + 1) {
        if (uVar6 < 3 && iVar5 != 4) {
          piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)&m,uVar6,iVar5,iVar3)
          ;
          shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = *piVar2 == this->scalar_;
          test((bool *)&shape0);
        }
        else {
          piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)&m,uVar6,iVar5,iVar3)
          ;
          shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = *piVar2 == 3;
          test((bool *)&shape0);
        }
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,(CoordinateOrder *)&shape0,
             (allocator_type *)&local_bc);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape0,0,(allocator_type *)&local_bc);
  begin_05._M_current._4_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_05._M_current._0_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_bc = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_05,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_bc);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,(CoordinateOrder *)&shape0,
             (allocator_type *)&local_bc);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape0,1,(allocator_type *)&local_bc);
  begin_06._M_current._4_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_06._M_current._0_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_06._M_current = 0xc;
  local_bc = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_06,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_bc);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  bVar7 = false;
  if ((sVar1 == 0xc) &&
     (bVar7 = false, m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 0xc
     )) {
    piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
    bVar7 = *piVar2 == this->scalar_;
  }
  local_bc = CONCAT31(local_bc._1_3_,bVar7);
  test((bool *)&local_bc);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,(CoordinateOrder *)&shape0,
             (allocator_type *)&local_bc);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape0,1,(allocator_type *)&local_bc);
  begin_07._M_current._4_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_07._M_current._0_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_07._M_current = 0xc;
  local_bc = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_07,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_bc);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  bVar7 = false;
  if ((sVar1 == 0xc) &&
     (bVar7 = false, m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 0xc
     )) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    bVar7 = sVar1 == 1;
  }
  local_bc = CONCAT31(local_bc._1_3_,bVar7);
  test((bool *)&local_bc);
  for (iVar3 = 0; iVar3 != 3; iVar3 = iVar3 + 1) {
    piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,iVar3);
    local_bc = CONCAT31(local_bc._1_3_,*piVar2 == this->scalar_);
    test((bool *)&local_bc);
  }
  for (iVar3 = 3; iVar3 != 0xc; iVar3 = iVar3 + 1) {
    piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,iVar3);
    local_bc = CONCAT31(local_bc._1_3_,*piVar2 == 3);
    test((bool *)&local_bc);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,(CoordinateOrder *)&shape0,
             (allocator_type *)&local_bc);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape0,2,(allocator_type *)&local_bc);
  begin_08._M_current._4_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_08._M_current._0_4_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_08._M_current = 6;
  begin_08._M_current[1] = 4;
  local_bc = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_08,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_bc);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  if (sVar1 == 6) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,1);
    bVar7 = false;
    if ((sVar1 == 4) &&
       (bVar7 = false,
       m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 0x18)) {
      sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                        (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
      bVar7 = sVar1 == 2;
    }
  }
  else {
    bVar7 = false;
  }
  local_bc = CONCAT31(local_bc._1_3_,bVar7);
  test((bool *)&local_bc);
  for (iVar3 = 0; iVar3 != 4; iVar3 = iVar3 + 1) {
    for (uVar6 = 0; uVar6 != 6; uVar6 = uVar6 + 1) {
      if (uVar6 < 3) {
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&m,uVar6,iVar3);
        local_bc = CONCAT31(local_bc._1_3_,*piVar2 == this->scalar_);
        test((bool *)&local_bc);
      }
      else {
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&m,uVar6,iVar3);
        local_bc = CONCAT31(local_bc._1_3_,*piVar2 == 3);
        test((bool *)&local_bc);
      }
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void MarrayTest::resizeTest() {
    // 1D
    {
        // shrink
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 12; 
            m.resize(shape.begin(), shape.end(), 12);

            test(m.shape(0)==12 &&
                   m.size()==12 &&
                   m.dimension()==1);
        }
        // shrink to dimension == 0 
        {
            std::vector<std::size_t> shape(1), shape0(0);
            shape[0] = 24; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            m.resize(shape0.begin(), shape0.end(), 1);
        }
        // shrink to scalar 
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 1; 
            m.resize(shape.begin(), shape.end(), 3);

            test(m.shape(0)==1 &&
                   m.size()==1 && 
                   m(0) == scalar_);
        }
        // grow scalar to 1D
        {
            int scalar = 1;
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::Marray<int> m(scalar);
            m.resize(shape.begin(), shape.end(), 3);

            test(m.shape(0)==24 &&
                   m.size()==24 &&
                   m.dimension() == 1);
            test(m(0) == 1);
            for(int i = 1; i < 24; ++i){
                test(m(i) == 3);
            }
        }
        // grow 1D
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 12; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 24; 
            m.resize(shape.begin(), shape.end(), 3);

            test(m.shape(0)==24 &&
                   m.size()==24 &&
                   m.dimension()==1);
            for(int i = 0; i < 24; ++i){
                if(i < 12) {
                    test(m(i) == scalar_);
                }
                else {
                    test(m(i) == 3); 
                }
            }
        }
        // grow scalar to 3D
        {
            int scalar = 1;
            andres::Marray<int> m(scalar); 
            std::vector<std::size_t> newShape(3);
            newShape[0] = 5;
            newShape[1] = 5; 
            newShape[2] = 2;
            m.resize(newShape.begin(), newShape.end(), 3);
        
            test(m.shape(0)==5 &&
                   m.shape(1)==5 &&
                   m.shape(2)==2 &&
                   m.size()==50 &&
                   m.dimension()==3);
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 5; ++y){
                for(int x = 0; x < 5; ++x){
                    if(y == 0 && z == 0 && x == 0) {
                        test(m(x, y, z) == 1);
                    }
                    else {
                        test(m(x, y, z) == 3);
                    }
                }
            }
        }
        // grow to 3D
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 12; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder); 
            std::vector<std::size_t> newShape(3);
            newShape[0] = 5;
            newShape[1] = 5; 
            newShape[2] = 2;
            m.resize(newShape.begin(), newShape.end(), 3);
        
            test(m.shape(0)==5 &&
                   m.shape(1)==5 &&
                   m.shape(2)==2 &&
                   m.size()==50 &&
                   m.dimension()==3);
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 5; ++y) {
                for(int x = 0; x < 5; ++x) {
                    if(y == 0 && z == 0 && x < 5) {
                        test(m(x, y, z) == scalar_);
                    }
                    else {
                        test(m(x, y, z) == 3);
                    }
                }
            }
        }
    }
    // 2D 
    {
        // shrink
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6; 
            shape[1] = 4;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 3; 
            shape[1] = 2; 
            m.resize(shape.begin(), shape.end(), 6);

            test(m.shape(0)==3 &&
                   m.shape(1)==2 &&
                   m.size()==6 &&
                   m.dimension()==2);
        }
        // grow
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 3; 
            shape[1] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 6; 
            shape[1] = 4; 
            m.resize(shape.begin(), shape.end(), 3);

            test(m.shape(0)==6 &&
                   m.shape(1)==4 &&
                   m.size()==24 &&
                   m.dimension()==2);
            for(int y = 0; y < 4; ++y){
                for(int x = 0; x < 6; ++x){
                    if(y < 2 && x < 3) {
                        test(m(x, y) == scalar_);
                    }
                    else {
                        test(m(x, y) == 3);
                    }
                }
            }
        }
        // shrink to dimension == 0
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6; 
            shape[1] = 4;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(0); 
            m.resize(newShape.begin(), newShape.end(), 3);
        }
        // shrink to scalar
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6; 
            shape[1] = 4;

            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(1); 
            newShape[0] = 12; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==12 &&
                   m.size()==12);
        }
        // shrink to 1D
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6; 
            shape[1] = 4;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(1); 
            newShape[0] = 12; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==12 &&
                   m.size()==12 &&
                   m.dimension()==1);
            for(int i = 0; i < 6; ++i)
                test(m(i) == scalar_);
            for(int i = 6; i < 12; ++i)
                test(m(i) == 3);
        }
        // grow to 3D
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 3; 
            shape[1] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(3);
            newShape[0] = 5;
            newShape[1] = 5; 
            newShape[2] = 2;
            m.resize(newShape.begin(), newShape.end(), 3);
        
            test(m.shape(0)==5 &&
                   m.shape(1)==5 &&
                   m.shape(2)==2 &&
                   m.size()==50 &&
                   m.dimension()==3);
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 5; ++y){
                for(int x = 0; x < 5; ++x){
                    if(y < 2 && z == 0 && x < 3) {
                        test(m(x, y, z) == scalar_);
                    }
                    else {
                        test(m(x, y, z) == 3);
                    }
                }
            }
        }
    }
    // 3D
    {
        // shrink
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 2;
            shape[1] = 2; 
            shape[2] = 2;
            m.resize(shape.begin(), shape.end(), 8);
        
            test(m.shape(0)==2 &&
                   m.shape(1)==2 &&
                   m.shape(2)==2 &&
                   m.size()==8 &&
                   m.dimension()==3);
        }
        // grow
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 5;
            shape[1] = 5; 
            shape[2] = 2;
            m.resize(shape.begin(), shape.end(), 3);
        
            test(m.shape(0)==5 &&
                   m.shape(1)==5 &&
                   m.shape(2)==2 &&
                   m.size()==50 &&
                   m.dimension()==3);
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 5; ++y){
                for(int x = 0; x < 5; ++x){
                    if(y < 4 && x < 3) {
                        test(m(x, y, z) == scalar_);
                    }                   
                    else {
                        test(m(x, y, z) == 3);
                    }
                }
            }
        }
        // shrink to dimension == 0
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(0); 
            m.resize(newShape.begin(), newShape.end(), 3);
        }
        // shrink to scalar
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(1); 
            newShape[0] = 12; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==12 &&
                   m.size()==12 &&
                   m(0) == scalar_);
        }
        // shrink to 1D
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(1); 
            newShape[0] = 12; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==12 &&
                   m.size()==12 &&
                   m.dimension()==1);
            for(int i = 0; i < 3; ++i)
                test(m(i) == scalar_);
            for(int i = 3; i < 12; ++i)
                test(m(i) == 3);
        }
        // shrink to 2D
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(2); 
            newShape[0] = 6; 
            newShape[1] = 4; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==6 &&
                   m.shape(1)==4 &&
                   m.size()==24 &&
                   m.dimension()==2);
            for(int y = 0; y < 4; ++y){
                for(int x = 0; x < 6; ++x){
                    if(y < 4 && x < 3) {
                        test(m(x, y) == scalar_);
                    }
                    else {
                        test(m(x, y) == 3);
                    }
                }
            }
        }
    }
}